

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_400578::CpuIntegrationTest_nmi_Test::~CpuIntegrationTest_nmi_Test
          (CpuIntegrationTest_nmi_Test *this)

{
  IMos6502 *pIVar1;
  
  (this->super_CpuIntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuIntegrationTest_002acc20;
  pIVar1 = (this->super_CpuIntegrationTest).cpu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
           .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl;
  if (pIVar1 != (IMos6502 *)0x0) {
    (*(pIVar1->super_ICpu)._vptr_ICpu[1])();
  }
  (this->super_CpuIntegrationTest).cpu._M_t.
  super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
  super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl = (IMos6502 *)0x0;
  (this->super_CpuIntegrationTest).mmu.super_IMmu._vptr_IMmu = (_func_int **)&PTR__FakeMmu_002ace28;
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->super_CpuIntegrationTest).mmu.memory_._M_t);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, nmi) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    e8        INX
    // $0605    4c 04 06  JMP $0604
    // nmi:
    // $1000    c8        INY
    // $1001    40        RTI
    load_hex_dump(0x0600,
            {0xa2, 0x00, 0xa0, 0x00, 0xe8, 0x4c, 0x04, 0x06, 0x00, 0x00});
    load_hex_dump(0x1000, {0xc8, 0x40, 0x00, 0x00});

    set_reset_address(0x0600);
    set_break_address(0xDEAD);
    set_nmi_address(0x1000);

    expected.x = 0x05;
    expected.y = 0x00;
    expected.pc = 0x0604;

    cpu->reset();
    // Run the loop 5 times to increase x
    step_execution(2 + 2 + (2 + 3) * 5); // ldx + ldy + (inx + jmp) * 5
    EXPECT_EQ(expected, registers);

    // Before jmp is finised, trigger an nmi
    step_execution(2 + 3 - 1); // inx + jmp - 1
    cpu->set_nmi(true);

    // jmp should finish before jumping to nmi
    expected.x = 0x06;
    step_execution(1);
    EXPECT_EQ(expected, registers);

    // Run rti subroutine and jump back
    expected.y = 0x01;
    expected.pc = 0x0604;
    expected.p |= FLAG_5;
    step_execution(7 + 2 + 6); // nmi + iny + rti
    EXPECT_EQ(expected, registers);
}